

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O3

void __thiscall EquationOr::~EquationOr(EquationOr *this)

{
  int iVar1;
  PatternEquation *pPVar2;
  
  (this->super_PatternEquation)._vptr_PatternEquation = (_func_int **)&PTR__EquationOr_003cd758;
  pPVar2 = this->left;
  iVar1 = pPVar2->refcount;
  pPVar2->refcount = iVar1 + -1;
  if (pPVar2 != (PatternEquation *)0x0 && iVar1 < 2) {
    (*pPVar2->_vptr_PatternEquation[1])();
  }
  pPVar2 = this->right;
  iVar1 = pPVar2->refcount;
  pPVar2->refcount = iVar1 + -1;
  if (pPVar2 != (PatternEquation *)0x0 && iVar1 < 2) {
    (*pPVar2->_vptr_PatternEquation[1])();
  }
  (this->super_PatternEquation)._vptr_PatternEquation = (_func_int **)&PTR__PatternEquation_003ce160
  ;
  TokenPattern::~TokenPattern(&(this->super_PatternEquation).resultpattern);
  return;
}

Assistant:

EquationOr::~EquationOr(void)

{
  PatternEquation::release(left);
  PatternEquation::release(right);
}